

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

bool LTFlightDataInit(void)

{
  int iVar1;
  logLevelTy lVar2;
  undefined8 uVar3;
  CURLcode resCurl;
  bool local_1;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    local_1 = true;
  }
  else {
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 5) {
      uVar3 = curl_easy_strerror(iVar1);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
             ,0x364,"LTFlightDataInit",logFATAL,"Could not initialize CURL: %s",uVar3);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LTFlightDataInit()
{
    // global init libcurl
    CURLcode resCurl = curl_global_init (CURL_GLOBAL_ALL);
    if ( resCurl != CURLE_OK )
    {
        // something went wrong
        LOG_MSG(logFATAL,ERR_CURL_INIT,curl_easy_strerror(resCurl));
        return false;
    }
    
    // Success
    return true;
}